

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputeOutputDir(cmGeneratorTarget *this,string *config,bool implib,string *out)

{
  TargetType TVar1;
  size_type sVar2;
  cmGlobalGenerator *pcVar3;
  cmMakefile *pcVar4;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string conf;
  string configPropStr;
  string propertyNameStr;
  string targetTypeName;
  string configUpper;
  cmGeneratorExpression local_1a8;
  cmCommandContext local_168;
  undefined1 local_140 [64];
  string local_100;
  pointer local_e0;
  long local_d8;
  char *local_c0;
  long local_b8;
  string local_a0 [32];
  Snapshot local_80;
  Snapshot local_68;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_100,(string *)config);
  pcVar6 = GetOutputTargetType(this,implib);
  std::__cxx11::string::string(local_a0,pcVar6,(allocator *)&local_1a8);
  std::__cxx11::string::string((string *)&local_c0,local_a0);
  if (local_b8 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_c0);
    pcVar6 = local_c0;
  }
  cmsys::SystemTools::UpperCase(&local_50,&local_100);
  std::__cxx11::string::string((string *)&local_e0,local_a0);
  if (local_d8 == 0) {
    local_e0 = (pointer)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_e0);
    std::__cxx11::string::append((string *)&local_e0);
  }
  std::__cxx11::string::string((string *)&local_1a8,(char *)local_e0,(allocator *)local_140);
  pcVar7 = GetProperty(this,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_1a8,pcVar6,(allocator *)local_140);
    pcVar6 = GetProperty(this,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (pcVar6 == (char *)0x0) {
      TVar1 = this->Target->TargetTypeValue;
      if (TVar1 - STATIC_LIBRARY < 3) {
        pcVar4 = this->Makefile;
        std::__cxx11::string::string
                  ((string *)&local_1a8,"LIBRARY_OUTPUT_PATH",(allocator *)local_140);
        cmMakefile::GetSafeDefinition(pcVar4,(string *)&local_1a8);
        std::__cxx11::string::assign((char *)out);
      }
      else {
        if (TVar1 != EXECUTABLE) goto LAB_0036d255;
        pcVar4 = this->Makefile;
        std::__cxx11::string::string
                  ((string *)&local_1a8,"EXECUTABLE_OUTPUT_PATH",(allocator *)local_140);
        cmMakefile::GetSafeDefinition(pcVar4,(string *)&local_1a8);
        std::__cxx11::string::assign((char *)out);
      }
      std::__cxx11::string::~string((string *)&local_1a8);
      goto LAB_0036d255;
    }
    cmState::Snapshot::Snapshot(&local_80,(cmState *)0x0);
    local_168.Name._M_dataplus._M_p = (pointer)&local_168.Name.field_2;
    local_168.Name._M_string_length = 0;
    local_168.Name.field_2._M_local_buf[0] = '\0';
    local_168.Line = 0;
    snapshot_00.Position.Tree = local_80.Position.Tree;
    snapshot_00.State = local_80.State;
    snapshot_00.Position.Position = local_80.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)local_140,snapshot_00,&local_168);
    cmGeneratorExpression::cmGeneratorExpression(&local_1a8,(cmListFileBacktrace *)local_140);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_140);
    std::__cxx11::string::~string((string *)&local_168);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(char *)&local_1a8);
    local_168.Name._M_dataplus._M_p = (pointer)local_140._0_8_;
    local_140._0_8_ = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_140);
    local_140._0_8_ = local_140 + 0x10;
    local_140._8_8_ = 0;
    local_140[0x10] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_168.Name._M_dataplus._M_p,this->LocalGenerator
               ,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_140);
    std::__cxx11::string::assign((char *)out);
    std::__cxx11::string::~string((string *)local_140);
    bVar5 = std::operator!=(out,pcVar6);
    if (bVar5) {
      std::__cxx11::string::assign((char *)&local_100);
    }
  }
  else {
    cmState::Snapshot::Snapshot(&local_68,(cmState *)0x0);
    local_168.Name._M_dataplus._M_p = (pointer)&local_168.Name.field_2;
    local_168.Name._M_string_length = 0;
    local_168.Name.field_2._M_local_buf[0] = '\0';
    local_168.Line = 0;
    snapshot.Position.Tree = local_68.Position.Tree;
    snapshot.State = local_68.State;
    snapshot.Position.Position = local_68.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_140,snapshot,&local_168);
    cmGeneratorExpression::cmGeneratorExpression(&local_1a8,(cmListFileBacktrace *)local_140);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_140);
    std::__cxx11::string::~string((string *)&local_168);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(char *)&local_1a8);
    local_168.Name._M_dataplus._M_p = (pointer)local_140._0_8_;
    local_140._0_8_ = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_140);
    local_140._0_8_ = local_140 + 0x10;
    local_140._8_8_ = 0;
    local_140[0x10] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_168.Name._M_dataplus._M_p,this->LocalGenerator
               ,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_140);
    std::__cxx11::string::assign((char *)out);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::assign((char *)&local_100);
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_168);
  cmGeneratorExpression::~cmGeneratorExpression(&local_1a8);
LAB_0036d255:
  sVar2 = out->_M_string_length;
  if (sVar2 == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)&local_1a8,out,pcVar6);
  std::__cxx11::string::operator=((string *)out,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (local_100._M_string_length != 0) {
    bVar5 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    pcVar6 = "${EFFECTIVE_PLATFORM_NAME}";
    if (!bVar5) {
      pcVar6 = "";
    }
    if (sVar2 != 0) {
      pcVar6 = "";
    }
    std::__cxx11::string::string((string *)&local_1a8,pcVar6,(allocator *)local_140);
    pcVar3 = this->LocalGenerator->GlobalGenerator;
    std::__cxx11::string::string((string *)local_140,"/",(allocator *)&local_168);
    (*pcVar3->_vptr_cmGlobalGenerator[0x10])(pcVar3,local_140,&local_100,&local_1a8,out);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  return sVar2 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                bool implib, std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(implib);
  const char* propertyName = 0;
  std::string propertyNameStr = targetTypeName;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = targetTypeName;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir)
      {
      conf = "";
      }
    }
  else if(this->GetType() == cmState::EXECUTABLE)
    {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  else if(this->GetType() == cmState::STATIC_LIBRARY ||
          this->GetType() == cmState::SHARED_LIBRARY ||
          this->GetType() == cmState::MODULE_LIBRARY)
    {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
    }
  if(out.empty())
    {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    bool iosPlatform = this->Makefile->PlatformIsAppleIos();
    std::string suffix =
      usesDefaultOutputDir && iosPlatform ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, suffix, out);
    }

  return usesDefaultOutputDir;
}